

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  DefineDirectiveSyntax *pDVar1;
  Preprocessor *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer ppDVar2;
  Token TVar3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar4;
  string_view text;
  string_view fmt;
  format_args args;
  string_view text_00;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  BumpAllocator alloc;
  Bag optionBag;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  SyntaxPrinter local_5c8;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_598;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> local_580;
  undefined1 local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_548;
  undefined8 uStack_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined8 local_518;
  undefined8 uStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  undefined8 uStack_500;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_4f0;
  Diagnostics local_4c0;
  Preprocessor local_3c8;
  
  local_4f0.arrays.groups_size_index = 0x3f;
  local_4f0.arrays.groups_size_mask = 1;
  local_4f0.arrays.elements_ = (value_type_pointer)0x0;
  local_4f0.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_4f0.size_ctrl.ml = 0;
  local_4f0.size_ctrl.size = 0;
  addParseOptions(this,(Bag *)&local_4f0);
  BumpAllocator::BumpAllocator((BumpAllocator *)&local_538.field_2);
  local_4c0.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)local_4c0.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_4c0.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       0;
  local_4c0.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       2;
  local_518 = 0;
  uStack_510 = 0;
  parsing::Preprocessor::Preprocessor
            (&local_3c8,&this->sourceManager,(BumpAllocator *)&local_538.field_2,&local_4c0,
             (Bag *)&local_4f0,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  SourceLoader::loadSources(&local_580,&this->sourceLoader);
  for (; local_580.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         local_580.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
         _M_impl.super__Vector_impl_data._M_start;
      local_580.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_580.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1) {
    parsing::Preprocessor::pushSource
              (&local_3c8,
               local_580.
               super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]);
  }
  do {
    TVar3 = parsing::Preprocessor::next(&local_3c8);
  } while (TVar3.kind != EndOfFile);
  this_00 = &local_3c8;
  parsing::Preprocessor::getDefinedMacros(&local_598,this_00);
  if (local_598.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_598.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppDVar2 = local_598.
              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pDVar1 = *ppDVar2;
      local_5c8.buffer._M_dataplus._M_p = (pointer)&local_5c8.buffer.field_2;
      local_5c8.buffer._M_string_length = 0;
      local_5c8.buffer.field_2._M_local_buf[0] = '\0';
      local_5c8.sourceManager = (SourceManager *)0x0;
      local_5c8.includePreprocessed = true;
      local_5c8.includeComments = false;
      local_5c8.squashNewlines = true;
      local_5c8.includeTrivia = false;
      local_5c8.includeMissing = false;
      local_5c8.includeSkipped = false;
      local_5c8.includeDirectives = false;
      TVar3.kind = (pDVar1->name).kind;
      TVar3._2_1_ = (pDVar1->name).field_0x2;
      TVar3.numFlags.raw = (pDVar1->name).numFlags.raw;
      TVar3.rawLen = (pDVar1->name).rawLen;
      TVar3.info = (pDVar1->name).info;
      slang::syntax::SyntaxPrinter::print(&local_5c8,TVar3);
      local_5c8.includeTrivia = true;
      if (pDVar1->formalArguments != (MacroFormalArgumentListSyntax *)0x0) {
        slang::syntax::SyntaxPrinter::print(&local_5c8,&pDVar1->formalArguments->super_SyntaxNode);
      }
      if (((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
           _M_extent_value != 0) &&
         (sVar4 = parsing::Token::trivia
                            ((pDVar1->body).
                             super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr),
         sVar4._M_extent._M_extent_value._M_extent_value == 0)) {
        text._M_str = " ";
        text._M_len = 1;
        slang::syntax::SyntaxPrinter::append(&local_5c8,text);
      }
      slang::syntax::SyntaxPrinter::print
                (&local_5c8,&(pDVar1->body).super_SyntaxListBase.super_SyntaxNode);
      local_548 = &local_538;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_548,local_5c8.buffer._M_dataplus._M_p,
                 local_5c8.buffer._M_dataplus._M_p + local_5c8.buffer._M_string_length);
      local_508 = local_548;
      uStack_500 = uStack_540;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x3;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_508;
      ::fmt::v11::vformat_abi_cxx11_((string *)local_568,(v11 *)0x47eb93,fmt,args);
      text_00._M_str = (char *)local_568._0_8_;
      text_00._M_len = local_568._8_8_;
      this_00 = (Preprocessor *)local_568._0_8_;
      OS::print(text_00);
      if ((Preprocessor *)local_568._0_8_ != (Preprocessor *)(local_568 + 0x10)) {
        this_00 = (Preprocessor *)(local_568._16_8_ + 1);
        operator_delete((void *)local_568._0_8_,(size_t)this_00);
      }
      if (local_548 != &local_538) {
        this_00 = (Preprocessor *)(local_538._M_dataplus._M_p + 1);
        operator_delete(local_548,(size_t)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8.buffer._M_dataplus._M_p != &local_5c8.buffer.field_2) {
        this_00 = (Preprocessor *)
                  (CONCAT71(local_5c8.buffer.field_2._M_allocated_capacity._1_7_,
                            local_5c8.buffer.field_2._M_local_buf[0]) + 1);
        operator_delete(local_5c8.buffer._M_dataplus._M_p,(size_t)this_00);
      }
      ppDVar2 = ppDVar2 + 1;
    } while (ppDVar2 !=
             local_598.
             super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_598.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (Preprocessor *)
              ((long)local_598.
                     super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_598.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_598.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,(size_t)this_00);
  }
  if (local_580.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (Preprocessor *)
              ((long)local_580.
                     super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_580.
                    super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_580.
                    super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                    _M_impl.super__Vector_impl_data._M_start,(size_t)this_00);
  }
  parsing::Preprocessor::~Preprocessor(&local_3c8);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_4c0,(EVP_PKEY_CTX *)this_00);
  BumpAllocator::~BumpAllocator((BumpAllocator *)&local_538.field_2);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_4f0);
  return;
}

Assistant:

void Driver::reportMacros() {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}